

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapper::setCurrentIndex(QDataWidgetMapper *this,int index)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QDataWidgetMapperPrivate *pQVar3;
  int in_ESI;
  long in_FS_OFFSET;
  QDataWidgetMapperPrivate *d;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  QPersistentModelIndex local_50 [3];
  QPersistentModelIndex local_38 [3];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDataWidgetMapper *)0x871654);
  if ((-1 < in_ESI) &&
     (iVar4 = in_ESI,
     iVar2 = QDataWidgetMapperPrivate::itemCount
                       ((QDataWidgetMapperPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff88)),
     iVar4 < iVar2)) {
    if (pQVar3->orientation == Horizontal) {
      pQVar1 = pQVar3->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
      (**(code **)(*(long *)pQVar1 + 0x60))(local_20,pQVar1,in_ESI,0,local_38);
      in_ESI = in_stack_ffffffffffffff7c;
    }
    else {
      pQVar1 = pQVar3->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_50);
      (**(code **)(*(long *)pQVar1 + 0x60))(local_20,pQVar1,0,in_ESI,local_50);
    }
    QPersistentModelIndex::operator=(&pQVar3->currentTopLeft,(QModelIndex *)local_20);
    QDataWidgetMapperPrivate::populate
              ((QDataWidgetMapperPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff78));
    currentIndexChanged((QDataWidgetMapper *)0x87174d,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDataWidgetMapper::setCurrentIndex(int index)
{
    Q_D(QDataWidgetMapper);

    if (index < 0 || index >= d->itemCount())
        return;
    d->currentTopLeft = d->orientation == Qt::Horizontal
                            ? d->model->index(index, 0, d->rootIndex)
                            : d->model->index(0, index, d->rootIndex);
    d->populate();

    emit currentIndexChanged(index);
}